

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorClassifier::_internal_add_numberofsupportvectorsperclass
          (SupportVectorClassifier *this,int32_t value)

{
  int32_t local_14;
  SupportVectorClassifier *pSStack_10;
  int32_t value_local;
  SupportVectorClassifier *this_local;
  
  local_14 = value;
  pSStack_10 = this;
  google::protobuf::RepeatedField<int>::Add(&this->numberofsupportvectorsperclass_,&local_14);
  return;
}

Assistant:

inline void SupportVectorClassifier::_internal_add_numberofsupportvectorsperclass(int32_t value) {
  numberofsupportvectorsperclass_.Add(value);
}